

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::CappedArray<char,_14UL>_>::dispose(Array<kj::CappedArray<char,_14UL>_> *this)

{
  CappedArray<char,_14UL> *pCVar1;
  size_t sVar2;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CappedArray<char,_14UL> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (CappedArray<char,_14UL> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pCVar1,0x18,sVar2,sVar2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }